

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall
FDrawInfo::DrawFloodedPlane(FDrawInfo *this,wallseg *ws,float planez,sector_t *sec,bool ceiling)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FDynamicColormap *pFVar5;
  FFlatVertexBuffer *pFVar6;
  FMaterial *this_00;
  undefined7 in_register_00000009;
  int sectorlightlevel;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  FQuadDrawer qd;
  GLSectorPlane plane;
  FColormap local_b8;
  FQuadDrawer local_a8;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  GLSectorPlane local_70;
  
  GLSectorPlane::GetFromSector(&local_70,sec,(int)CONCAT71(in_register_00000009,ceiling));
  this_00 = FMaterial::ValidateTexture(local_70.texture,false,true);
  if (this_00 == (FMaterial *)0x0) {
    return;
  }
  if (gl_fixedcolormap == 0) {
    pFVar5 = sec->ColorMap;
    local_b8.LightColor.field_0 = (pFVar5->Color).field_0;
    local_b8.FadeColor.field_0 = (pFVar5->Fade).field_0;
    local_b8._8_8_ = CONCAT44(local_b8._3_4_,pFVar5->Desaturate) & 0xffffffffff;
    if (((this_00->tex->gl_info).field_0x4c & 8) == 0) {
      if (ceiling) {
        iVar7 = sector_t::GetCeilingLight(sec);
      }
      else {
        iVar7 = sector_t::GetFloorLight(sec);
      }
      sectorlightlevel = -iVar7;
      if (0 < iVar7) {
        sectorlightlevel = iVar7;
      }
      goto LAB_0046606f;
    }
    local_b8.LightColor.field_0.d._0_3_ = 0xffffff;
  }
  else {
    local_b8.LightColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
    local_b8.FadeColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
    local_b8.desaturation = 0;
    local_b8.blendfactor = 0;
  }
  sectorlightlevel = 0xff;
LAB_0046606f:
  iVar7 = gl_weaponlight.Value * extralight;
  gl_SetColor(sectorlightlevel,iVar7,&local_b8,1.0,false);
  gl_SetFog(sectorlightlevel,iVar7,&local_b8,false);
  gl_RenderState.mEffectState = this_00->mShaderIndex;
  gl_RenderState.mShaderTimer = (this_00->tex->gl_info).shaderspeed;
  FMaterial::Bind(this_00,0,0);
  fVar9 = (float)ViewPos.Z;
  local_98 = ZEXT416((uint)(planez - fVar9));
  local_88 = (float)ViewPos.X;
  fStack_84 = (float)ViewPos.Y;
  uStack_80 = 0;
  gl_SetPlaneTextureRotation(&local_70,this_00);
  uVar8 = (uint)this_00;
  FRenderState::Apply(&gl_RenderState);
  iVar7 = gl.buffermethod;
  fVar14 = (float)local_98._0_4_ / (ws->z1 - fVar9);
  fVar9 = (float)local_98._0_4_ / (ws->z2 - fVar9);
  uVar1 = ws->x1;
  uVar3 = ws->y1;
  fVar12 = ((float)uVar1 - local_88) * fVar14 + local_88;
  fVar13 = ((float)uVar3 - fStack_84) * fVar14 + fStack_84;
  fVar10 = ((float)uVar1 - local_88) * fVar9 + local_88;
  fVar11 = ((float)uVar3 - fStack_84) * fVar9 + fStack_84;
  uVar2 = ws->x2;
  uVar4 = ws->y2;
  fVar15 = fVar9 * ((float)uVar2 - local_88) + local_88;
  fVar16 = fVar9 * ((float)uVar4 - fStack_84) + fStack_84;
  fVar9 = ((float)uVar2 - local_88) * fVar14 + local_88;
  fVar14 = ((float)uVar4 - fStack_84) * fVar14 + fStack_84;
  if (gl.buffermethod == 1) {
    local_a8.p = FQuadDrawer::buffer;
  }
  else {
    pFVar6 = GLRenderer->mVBO;
    uVar8 = pFVar6->mCurIndex;
    pFVar6->mCurIndex = uVar8 + 4;
    if (0x1e828b < uVar8 + 4) {
      pFVar6->mCurIndex = pFVar6->mIndex;
    }
    local_a8.p = pFVar6->map + uVar8;
    local_a8.ndx = uVar8;
  }
  (local_a8.p)->x = fVar12;
  (local_a8.p)->z = planez;
  (local_a8.p)->y = fVar13;
  (local_a8.p)->u = fVar12 * 0.015625;
  (local_a8.p)->v = fVar13 * -0.015625;
  local_a8.p[1].x = fVar10;
  local_a8.p[1].z = planez;
  local_a8.p[1].y = fVar11;
  local_a8.p[1].u = fVar10 * 0.015625;
  local_a8.p[1].v = fVar11 * -0.015625;
  local_a8.p[2].x = fVar15;
  local_a8.p[2].z = planez;
  local_a8.p[2].y = fVar16;
  local_a8.p[2].u = fVar15 * 0.015625;
  local_a8.p[2].v = fVar16 * -0.015625;
  local_a8.p[3].x = fVar9;
  local_a8.p[3].z = planez;
  local_a8.p[3].y = fVar14;
  local_a8.p[3].u = fVar9 * 0.015625;
  local_a8.p[3].v = fVar14 * -0.015625;
  if (iVar7 == 1) {
    FQuadDrawer::DoRender(&local_a8,6);
  }
  else {
    (*_ptrc_glDrawArrays)(6,uVar8,4);
  }
  gl_RenderState.mTextureMatrixEnabled = false;
  return;
}

Assistant:

void FDrawInfo::DrawFloodedPlane(wallseg * ws, float planez, sector_t * sec, bool ceiling)
{
	GLSectorPlane plane;
	int lightlevel;
	FColormap Colormap;
	FMaterial * gltexture;

	plane.GetFromSector(sec, ceiling);

	gltexture=FMaterial::ValidateTexture(plane.texture, false, true);
	if (!gltexture) return;

	if (gl_fixedcolormap) 
	{
		Colormap.Clear();
		lightlevel=255;
	}
	else
	{
		Colormap=sec->ColorMap;
		if (gltexture->tex->isFullbright())
		{
			Colormap.LightColor.r = Colormap.LightColor.g = Colormap.LightColor.b = 0xff;
			lightlevel=255;
		}
		else lightlevel=abs(ceiling? sec->GetCeilingLight() : sec->GetFloorLight());
	}

	int rel = getExtraLight();
	gl_SetColor(lightlevel, rel, Colormap, 1.0f);
	gl_SetFog(lightlevel, rel, &Colormap, false);
	gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);

	float fviewx = ViewPos.X;
	float fviewy = ViewPos.Y;
	float fviewz = ViewPos.Z;

	gl_SetPlaneTextureRotation(&plane, gltexture);
	gl_RenderState.Apply();

	float prj_fac1 = (planez-fviewz)/(ws->z1-fviewz);
	float prj_fac2 = (planez-fviewz)/(ws->z2-fviewz);

	float px1 = fviewx + prj_fac1 * (ws->x1-fviewx);
	float py1 = fviewy + prj_fac1 * (ws->y1-fviewy);

	float px2 = fviewx + prj_fac2 * (ws->x1-fviewx);
	float py2 = fviewy + prj_fac2 * (ws->y1-fviewy);

	float px3 = fviewx + prj_fac2 * (ws->x2-fviewx);
	float py3 = fviewy + prj_fac2 * (ws->y2-fviewy);

	float px4 = fviewx + prj_fac1 * (ws->x2-fviewx);
	float py4 = fviewy + prj_fac1 * (ws->y2-fviewy);

	FQuadDrawer qd;
	qd.Set(0, px1, planez, py1, px1 / 64, -py1 / 64);
	qd.Set(1, px2, planez, py2, px2 / 64, -py2 / 64);
	qd.Set(2, px3, planez, py3, px3 / 64, -py3 / 64);
	qd.Set(3, px4, planez, py4, px4 / 64, -py4 / 64);
	qd.Render(GL_TRIANGLE_FAN);

	gl_RenderState.EnableTextureMatrix(false);
}